

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O2

int __thiscall vector<server::ban>::remove(vector<server::ban> *this,char *__filename)

{
  int in_EDX;
  long lVar1;
  long lVar2;
  
  lVar2 = (long)in_EDX;
  lVar1 = lVar2 * 0x18;
  server::ban::ban((ban *)this,(ban *)(*(long *)__filename + lVar1));
  while( true ) {
    lVar2 = lVar2 + 1;
    if (*(int *)(__filename + 0xc) <= lVar2) break;
    server::ban::operator=
              ((ban *)(*(long *)__filename + lVar1),(ban *)(*(long *)__filename + lVar1 + 0x18));
    lVar1 = lVar1 + 0x18;
  }
  *(int *)(__filename + 0xc) = *(int *)(__filename + 0xc) + -1;
  return (int)this;
}

Assistant:

T remove(int i)
    {
        T e = buf[i];
        for(int p = i+1; p<ulen; p++) buf[p-1] = buf[p];
        ulen--;
        return e;
    }